

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  bool bVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  int iVar5;
  ImU32 IVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  int iVar9;
  int iVar10;
  ImGuiCol IVar11;
  float fVar12;
  float fVar13;
  ImU32 local_204;
  ImU32 local_1f4;
  float local_18c;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 pos1;
  ImVec2 pos0;
  ImVec2 tp1;
  float v1_1;
  int v1_idx;
  float t1;
  int n;
  ImU32 col_hovered;
  ImU32 col_base;
  ImVec2 tp0;
  float t0;
  float v0;
  float t_step;
  float v1;
  float v0_1;
  int v_idx;
  float t;
  int v_hovered;
  int item_count;
  int res_w;
  int local_cc;
  float v;
  int i;
  float v_max;
  float v_min;
  ImVec2 local_b8;
  undefined1 local_b0 [8];
  ImRect total_bb;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect inner_bb;
  ImVec2 local_78;
  undefined1 local_70 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float scale_max_local;
  float scale_min_local;
  int values_offset_local;
  int values_count_local;
  void *data_local;
  _func_float_void_ptr_int *values_getter_local;
  char *label_local;
  float fStack_10;
  ImGuiPlotType plot_type_local;
  ImVec2 graph_size_local;
  
  pIVar8 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar8->SkipItems & 1U) == 0) {
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fStack_10 = graph_size.x;
    bVar3 = NAN(fStack_10);
    bVar1 = fStack_10 == 0.0;
    _fStack_10 = graph_size;
    if ((bVar1) && (!bVar3)) {
      fStack_10 = CalcItemWidth();
      plot_type_local = (ImGuiPlotType)graph_size.y;
    }
    if (((float)plot_type_local == 0.0) && (!NAN((float)plot_type_local))) {
      fVar12 = (pIVar2->Style).FramePadding.y;
      plot_type_local = (ImGuiPlotType)(fVar12 + fVar12 + frame_bb.Max.y);
    }
    ImVec2::ImVec2(&inner_bb.Max,fStack_10,(float)plot_type_local);
    local_78 = ::operator+(&(pIVar8->DC).CursorPos,&inner_bb.Max);
    ImRect::ImRect((ImRect *)local_70,&(pIVar8->DC).CursorPos,&local_78);
    local_98 = ::operator+((ImVec2 *)local_70,&(pIVar2->Style).FramePadding);
    total_bb.Max = ::operator-(&frame_bb.Min,&(pIVar2->Style).FramePadding);
    ImRect::ImRect((ImRect *)local_90,&local_98,&total_bb.Max);
    if (frame_bb.Max.x <= 0.0) {
      local_18c = 0.0;
    }
    else {
      local_18c = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&v_max,local_18c,0.0);
    local_b8 = ::operator+(&frame_bb.Min,(ImVec2 *)&v_max);
    ImRect::ImRect((ImRect *)local_b0,(ImVec2 *)local_70,&local_b8);
    ItemSize((ImRect *)local_b0,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_b0,(ImGuiID *)0x0);
    if (bVar3) {
      window._0_4_ = scale_max;
      window._4_4_ = scale_min;
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((scale_max == 3.4028235e+38 && (!NAN(scale_max))))) {
        i = 0x7f7fffff;
        v = -3.4028235e+38;
        for (local_cc = 0; local_cc < values_count; local_cc = local_cc + 1) {
          fVar12 = (*values_getter)(data,local_cc);
          i = (int)ImMin((float)i,fVar12);
          v = ImMax(v,fVar12);
        }
        if ((scale_min == 3.4028235e+38) && (!NAN(scale_min))) {
          window._4_4_ = (float)i;
        }
        if ((scale_max == 3.4028235e+38) && (!NAN(scale_max))) {
          window._0_4_ = v;
        }
      }
      p_min.y = (float)local_70._4_4_;
      p_min.x = (float)local_70._0_4_;
      p_max.y = frame_bb.Min.y;
      p_max.x = frame_bb.Min.x;
      IVar4 = GetColorU32(7,1.0);
      RenderFrame(p_min,p_max,IVar4,true,(pIVar2->Style).FrameRounding);
      iVar5 = ImMin((int)fStack_10,values_count);
      iVar9 = 0;
      if (plot_type == ImGuiPlotType_Lines) {
        iVar9 = -1;
      }
      iVar10 = 0;
      if (plot_type == ImGuiPlotType_Lines) {
        iVar10 = -1;
      }
      v_idx = -1;
      bVar3 = IsHovered((ImRect *)local_90,0,false);
      if (bVar3) {
        fVar12 = ImClamp(((pIVar2->IO).MousePos.x - (float)local_90._0_4_) /
                         (inner_bb.Min.x - (float)local_90._0_4_),0.0,0.9999);
        v_idx = (int)(fVar12 * (float)(values_count + iVar10));
        if (v_idx < 0 || values_count <= v_idx) {
          __assert_fail("v_idx >= 0 && v_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bb1,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar12 = (*values_getter)(data,(v_idx + values_offset) % values_count);
        fVar13 = (*values_getter)(data,(int)(v_idx + 1U + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(double)fVar12,(double)fVar13,(ulong)(uint)v_idx,
                     (ulong)(v_idx + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar12,(ulong)(uint)v_idx);
        }
      }
      tp0.y = (*values_getter)(data,values_offset % values_count);
      tp0.x = 0.0;
      fVar12 = ImSaturate((tp0.y - window._4_4_) / (window._0_4_ - window._4_4_));
      ImVec2::ImVec2((ImVec2 *)&col_hovered,0.0,1.0 - fVar12);
      IVar11 = 0x27;
      if (plot_type == ImGuiPlotType_Lines) {
        IVar11 = 0x25;
      }
      IVar4 = GetColorU32(IVar11,1.0);
      IVar11 = 0x28;
      if (plot_type == ImGuiPlotType_Lines) {
        IVar11 = 0x26;
      }
      IVar6 = GetColorU32(IVar11,1.0);
      for (v1_idx = 0; v1_idx < iVar5 + iVar9; v1_idx = v1_idx + 1) {
        fVar12 = tp0.x + 1.0 / (float)(iVar5 + iVar9);
        iVar7 = (int)(tp0.x * (float)(values_count + iVar10) + 0.5);
        if (iVar7 < 0 || values_count <= iVar7) {
          __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bc9,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar13 = (*values_getter)(data,(iVar7 + 1 + values_offset) % values_count);
        fVar13 = ImSaturate((fVar13 - window._4_4_) / (window._0_4_ - window._4_4_));
        ImVec2::ImVec2(&pos0,fVar12,1.0 - fVar13);
        pos1 = ImLerp((ImVec2 *)local_90,&inner_bb.Min,(ImVec2 *)&col_hovered);
        if (plot_type != ImGuiPlotType_Lines) {
          ImVec2::ImVec2(&local_148,pos0.x,1.0);
        }
        local_140 = ImLerp((ImVec2 *)local_90,&inner_bb.Min,&local_148);
        if (plot_type == ImGuiPlotType_Lines) {
          local_1f4 = IVar4;
          if (v_idx == iVar7) {
            local_1f4 = IVar6;
          }
          ImDrawList::AddLine(pIVar8->DrawList,&pos1,&local_140,local_1f4,1.0);
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          if (pos1.x + 2.0 <= local_140.x) {
            local_140.x = local_140.x - 1.0;
          }
          local_204 = IVar4;
          if (v_idx == iVar7) {
            local_204 = IVar6;
          }
          ImDrawList::AddRectFilled(pIVar8->DrawList,&pos1,&local_140,local_204,0.0,0xf);
        }
        tp0.x = fVar12;
      }
      if (overlay_text != (char *)0x0) {
        ImVec2::ImVec2(&local_150,(float)local_70._0_4_,
                       (float)local_70._4_4_ + (pIVar2->Style).FramePadding.y);
        ImVec2::ImVec2(&local_158,0.5,0.0);
        RenderTextClipped(&local_150,&frame_bb.Min,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_158
                          ,(ImRect *)0x0);
      }
      if (0.0 < frame_bb.Max.x) {
        ImVec2::ImVec2(&local_160,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                       (float)local_90._4_4_);
        RenderText(local_160,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, NULL))
        return;

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
    int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

    // Tooltip on hover
    int v_hovered = -1;
    if (IsHovered(inner_bb, 0))
    {
        const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
        const int v_idx = (int)(t * item_count);
        IM_ASSERT(v_idx >= 0 && v_idx < values_count);

        const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
        const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines)
            SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
        else if (plot_type == ImGuiPlotType_Histogram)
            SetTooltip("%d: %8.4g", v_idx, v0);
        v_hovered = v_idx;
    }

    const float t_step = 1.0f / (float)res_w;

    float v0 = values_getter(data, (0 + values_offset) % values_count);
    float t0 = 0.0f;
    ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) / (scale_max - scale_min)) );    // Point in the normalized space of our target rectangle

    const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
    const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

    for (int n = 0; n < res_w; n++)
    {
        const float t1 = t0 + t_step;
        const int v1_idx = (int)(t0 * item_count + 0.5f);
        IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
        const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
        const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) / (scale_max - scale_min)) );

        // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
        ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
        ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, 1.0f));
        if (plot_type == ImGuiPlotType_Lines)
        {
            window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }
        else if (plot_type == ImGuiPlotType_Histogram)
        {
            if (pos1.x >= pos0.x + 2.0f)
                pos1.x -= 1.0f;
            window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }

        t0 = t1;
        tp0 = tp1;
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}